

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O3

void __thiscall QLineEditIconButton::updateCursor(QLineEditIconButton *this)

{
  long in_FS_OFFSET;
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  dVar4 = this->m_opacity;
  dVar3 = dVar4 + -1.0;
  uVar1 = -(ulong)(dVar3 < -dVar3);
  uVar2 = -(ulong)(dVar4 < -dVar4);
  dVar4 = (double)(~uVar2 & (ulong)dVar4 | (ulong)-dVar4 & uVar2);
  if (1.0 <= dVar4) {
    dVar4 = 1.0;
  }
  if (((double)(~uVar1 & (ulong)dVar3 | (ulong)-dVar3 & uVar1) * 1000000000000.0 <= dVar4) ||
     (*(long *)(*(long *)&(this->super_QToolButton).super_QAbstractButton.super_QWidget.field_0x8 +
               0x10) == 0)) {
    QCursor::QCursor((QCursor *)&stack0xffffffffffffffe0,ArrowCursor);
  }
  else {
    QWidget::cursor((QWidget *)&stack0xffffffffffffffe0);
  }
  QWidget::setCursor((QWidget *)this,(QCursor *)&stack0xffffffffffffffe0);
  QCursor::~QCursor((QCursor *)&stack0xffffffffffffffe0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLineEditIconButton::updateCursor()
{
#ifndef QT_NO_CURSOR
    setCursor(qFuzzyCompare(m_opacity, qreal(1.0)) || !parentWidget() ? QCursor(Qt::ArrowCursor) : parentWidget()->cursor());
#endif
}